

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O0

void Gia_ManSimPatSimPo(Gia_Man_t *p,int i,Gia_Obj_t *pObj,int nWords,Vec_Wrd_t *vSims)

{
  ulong uVar1;
  int iVar2;
  word *pwVar3;
  int local_6c;
  int w;
  word *pSims2;
  word *pSims0;
  word *pSims;
  word Diff0;
  word pComps [2];
  Vec_Wrd_t *vSims_local;
  int nWords_local;
  Gia_Obj_t *pObj_local;
  int i_local;
  Gia_Man_t *p_local;
  
  pComps[0] = 0xffffffffffffffff;
  iVar2 = Gia_ObjFaninC0(pObj);
  uVar1 = pComps[(long)iVar2 + -1];
  pwVar3 = Vec_WrdArray(vSims);
  iVar2 = Gia_ObjFaninId0(pObj,i);
  for (local_6c = 0; local_6c < nWords; local_6c = local_6c + 1) {
    pwVar3[(long)(nWords * i) + (long)local_6c] =
         pwVar3[(long)(nWords * iVar2) + (long)local_6c] ^ uVar1;
  }
  return;
}

Assistant:

static inline void Gia_ManSimPatSimPo( Gia_Man_t * p, int i, Gia_Obj_t * pObj, int nWords, Vec_Wrd_t * vSims )
{
    word pComps[2] = { 0, ~(word)0 };
    word Diff0     = pComps[Gia_ObjFaninC0(pObj)];
    word * pSims   = Vec_WrdArray(vSims);
    word * pSims0  = pSims + nWords*Gia_ObjFaninId0(pObj, i);
    word * pSims2  = pSims + nWords*i; int w;
    for ( w = 0; w < nWords; w++ )
        pSims2[w]  = (pSims0[w] ^ Diff0);
}